

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpNodeList(FILE *output,xmlNodePtr node,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_c0;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  xmlCtxtDumpInitCtxt(&local_c0);
  local_c0.output = output;
  local_c0.depth = depth;
  xmlCtxtDumpNodeList(&local_c0,node);
  return;
}

Assistant:

void
xmlDebugDumpNodeList(FILE * output, xmlNodePtr node, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpNodeList(&ctxt, node);
    xmlCtxtDumpCleanCtxt(&ctxt);
}